

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool basist::pack_astc_block(uint32_t *pDst,astc_block_desc *pBlock,uint32_t uastc_mode)

{
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint8_t *puVar10;
  byte *pbVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint32_t temp [5];
  byte local_a4 [8];
  uint local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  uint8_t *local_80;
  ulong local_78;
  ulong uStack_70;
  undefined4 local_68;
  uint local_64 [3];
  ulong local_58;
  ulong local_50;
  ulong *local_48;
  ulong local_40;
  ulong local_38;
  
  if (0x12 < uastc_mode) {
    __assert_fail("uastc_mode < TOTAL_UASTC_MODES",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e73,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  bVar1 = pBlock->m_dual_plane;
  uVar3 = *(undefined4 *)(g_uastc_mode_astc_block_mode + (ulong)uastc_mode * 4);
  *(char *)pDst = (char)uVar3;
  bVar6 = (byte)((uint)uVar3 >> 8);
  *(byte *)((long)pDst + 1) = bVar6;
  *(undefined8 *)((long)pDst + 2) = 0;
  pDst[2] = 0;
  pDst[3] = 0;
  if ((*(int *)(g_astc_bise_range_table + (long)pBlock->m_weight_range * 0xc + 4) != 0) ||
     (lVar9 = (long)pBlock->m_weight_range * 0xc, *(int *)(g_astc_bise_range_table + lVar9 + 8) != 0
     )) {
    __assert_fail("!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e82,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  uVar14 = *(uint *)(g_astc_bise_range_table + lVar9);
  bVar6 = (char)pBlock->m_subsets * '\b' - 8U | bVar6;
  *(byte *)((long)pDst + 1) = bVar6;
  if (pBlock->m_subsets == 1) {
    uVar13 = pBlock->m_cem;
    *(byte *)((long)pDst + 1) = bVar6 | (byte)(uVar13 << 5);
    *(char *)((long)pDst + 2) = (char)(uVar13 >> 3);
    uVar8 = 0x11;
  }
  else {
    uVar13 = pBlock->m_partition_seed;
    iVar4 = 10;
    uVar7 = 0xd;
    do {
      iVar5 = 8 - (uVar7 & 7);
      if (iVar4 < iVar5) {
        iVar5 = iVar4;
      }
      uVar8 = iVar5 + uVar7;
      pbVar11 = (byte *)((long)pDst + (long)((int)uVar7 >> 3));
      *pbVar11 = *pbVar11 | (byte)(uVar13 << (sbyte)(uVar7 & 7));
      uVar13 = uVar13 >> ((byte)iVar5 & 0x1f);
      iVar4 = iVar4 - iVar5;
      uVar7 = uVar8;
    } while (iVar4 != 0);
    iVar4 = ((pBlock->m_cem & 0xfU) << 2) << (sbyte)(uVar8 & 7);
    pbVar11 = (byte *)((long)pDst + (ulong)(uint)((int)uVar8 >> 3));
    *pbVar11 = *pbVar11 | (byte)iVar4;
    if (2 < (uVar8 & 7)) {
      pbVar11 = (byte *)((long)pDst + (ulong)(((int)uVar8 >> 3) + 1));
      *pbVar11 = *pbVar11 | (byte)((uint)iVar4 >> 8);
    }
    uVar8 = uVar8 + 6;
  }
  if (pBlock->m_dual_plane == true) {
    iVar4 = uVar14 << (bVar1 + 4U & 0x1f);
    if (0x48 < iVar4 - 0x18U) {
      __assert_fail("(total_weight_bits >= 24) && (total_weight_bits <= 96)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2e99,
                    "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
    }
    pbVar11 = (byte *)((long)pDst + (ulong)(0x78U - iVar4 >> 3));
    *pbVar11 = *pbVar11 | (char)pBlock->m_ccs << 6;
  }
  iVar4 = ((pBlock->m_cem >> 2) + 1) * pBlock->m_subsets;
  if (9 < iVar4) {
    __assert_fail("num_cem_pairs <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ea0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  local_50 = (ulong)uVar14;
  local_48 = (ulong *)pDst;
  local_80 = pBlock->m_endpoints;
  uVar13 = iVar4 * 2;
  uVar15 = (ulong)(byte)g_uastc_mode_endpoint_ranges[uastc_mode];
  local_9c = uVar8;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uVar14 = *(uint *)(g_astc_bise_range_table + uVar15 * 0xc);
  local_84 = *(int *)(g_astc_bise_range_table + uVar15 * 0xc + 4);
  local_58 = (ulong)bVar1;
  if (*(int *)(g_astc_bise_range_table + uVar15 * 0xc + 4) == 0) {
    if (*(int *)(g_astc_bise_range_table + uVar15 * 0xc + 8) == 0) {
      if (0 < iVar4) {
        if (9 < uVar14) {
          __assert_fail("codesize <= 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x2dac,
                        "void basist::astc_set_bits_1_to_9(uint32_t *, int &, uint32_t, uint32_t)");
        }
        uVar15 = 0;
        do {
          if (uVar14 != 0) {
            iVar4 = (uint)pBlock->m_endpoints[uVar15] << (sbyte)(uVar8 & 7);
            pbVar11 = (byte *)((long)&local_78 + (ulong)(uint)((int)uVar8 >> 3));
            *pbVar11 = *pbVar11 | (byte)iVar4;
            if (8 - (uVar8 & 7) < uVar14) {
              pbVar11 = (byte *)((long)&local_78 + (ulong)(((int)uVar8 >> 3) + 1));
              *pbVar11 = *pbVar11 | (byte)((uint)iVar4 >> 8);
            }
          }
          uVar15 = uVar15 + 1;
          uVar8 = uVar8 + uVar14;
        } while (uVar13 != uVar15);
      }
      goto LAB_001323b2;
    }
    uVar7 = 3;
    iVar4 = 2;
  }
  else {
    uVar7 = 5;
    iVar4 = 4;
  }
  uVar15 = (long)(int)(iVar4 + uVar13) / (long)(int)uVar7;
  if (0 < (int)uVar15) {
    bVar6 = (byte)uVar14;
    local_98 = uVar14 * 3 + 7;
    local_88 = uVar14 + 3;
    local_8c = uVar14 * 2 + 3;
    local_90 = uVar14 * 2 + 5;
    local_94 = uVar14 * 3 + 5;
    local_40 = (ulong)uVar7;
    local_38 = uVar15 & 0xffffffff;
    uVar15 = 0;
    do {
      local_a4[4] = 0;
      local_a4[0] = 0;
      local_a4[1] = 0;
      local_a4[2] = 0;
      local_a4[3] = 0;
      iVar4 = uVar7 * (int)uVar15;
      uVar8 = uVar13 - iVar4;
      if (uVar8 != 0 && iVar4 <= (int)uVar13) {
        if ((int)uVar7 < (int)uVar8) {
          uVar8 = uVar7;
        }
        if ((int)uVar8 < 2) {
          uVar8 = 1;
        }
        memcpy(local_a4,local_80 + uVar15 * local_40,(ulong)uVar8);
      }
      if (local_84 == 0) {
        lVar9 = 0;
        pbVar11 = local_a4;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (uint)(*pbVar11 >> (bVar6 & 0x1f)) *
                          *(int *)((long)&astc_encode_quints(unsigned_int*,unsigned_char_const*,int&,int)
                                          ::s_muls + lVar9);
          *(uint *)((long)local_64 + lVar9) = (uint)*pbVar11 & ~(-1 << (bVar6 & 0x1f));
          lVar9 = lVar9 + 4;
          pbVar11 = pbVar11 + 1;
        } while (lVar9 != 0xc);
        if (0x7c < iVar4) {
          __assert_fail("quints < 125",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                        ,0x2e37,
                        "void basist::astc_encode_quints(uint32_t *, const uint8_t *, int &, int)");
        }
        if (local_98 != 0) {
          bVar2 = g_astc_quint_encode[iVar4];
          uVar8 = local_64[1] << ((byte)local_88 & 0x1f) | local_64[0] |
                  local_64[2] << ((byte)local_90 & 0x1f) | (bVar2 & 7) << (bVar6 & 0x1f) |
                  (bVar2 >> 3 & 3) << ((byte)local_8c & 0x1f) |
                  (bVar2 >> 5 & 3) << ((byte)local_94 & 0x1f);
          iVar4 = local_98;
          do {
            iVar5 = 8 - (local_9c & 7);
            if (iVar4 < iVar5) {
              iVar5 = iVar4;
            }
            uVar12 = iVar5 + local_9c;
            pbVar11 = (byte *)((long)&local_78 + (long)((int)local_9c >> 3));
            *pbVar11 = *pbVar11 | (byte)(uVar8 << (sbyte)(local_9c & 7));
            uVar8 = uVar8 >> ((byte)iVar5 & 0x1f);
            iVar4 = iVar4 - iVar5;
            local_9c = uVar12;
          } while (iVar4 != 0);
        }
      }
      else {
        astc_encode_trits((uint32_t *)&local_78,local_a4,(int *)&local_9c,uVar14);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_38);
  }
LAB_001323b2:
  *local_48 = *local_48 | local_78;
  local_48[1] = local_48[1] | uStack_70;
  if (4 < (int)local_50 - 1U) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ef0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  uVar14 = (int)local_58 * 0x10 + 0x10;
  switch((int)local_50) {
  case 1:
    uVar13 = 0x7f;
    uVar15 = 0;
    do {
      pbVar11 = (byte *)((long)local_48 + (ulong)(uVar13 >> 3));
      *pbVar11 = *pbVar11 | pBlock->m_weights[uVar15] << ((byte)uVar13 & 7);
      uVar15 = uVar15 + 1;
      uVar13 = uVar13 - 1;
    } while (uVar14 != uVar15);
    break;
  case 2:
    uVar13 = 0x7e;
    uVar15 = 0;
    do {
      pbVar11 = (byte *)((long)local_48 + (ulong)(uVar13 >> 3));
      *pbVar11 = *pbVar11 | ""[pBlock->m_weights[uVar15]] << ((byte)uVar13 & 6);
      uVar15 = uVar15 + 1;
      uVar13 = uVar13 - 2;
    } while (uVar14 != uVar15);
    break;
  case 3:
    uVar13 = 0x7d;
    uVar15 = 0;
    do {
      iVar4 = (uint)""[pBlock->m_weights[uVar15]] << ((byte)uVar13 & 7);
      if (uVar15 == 0x2a) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ec9,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      pbVar11 = (byte *)((long)local_48 + (ulong)(uVar13 >> 3));
      *pbVar11 = *pbVar11 | (byte)iVar4;
      if (uVar13 < 0x78) {
        pbVar11 = (byte *)((long)local_48 + (ulong)(uVar13 >> 3) + 1);
        *pbVar11 = *pbVar11 | (byte)((uint)iVar4 >> 8);
      }
      uVar15 = uVar15 + 1;
      uVar13 = uVar13 - 3;
    } while (uVar14 != uVar15);
    break;
  case 4:
    puVar10 = pBlock->m_weights;
    iVar4 = 0x7c;
    uVar15 = 0;
    do {
      if ((0x7c < (long)uVar15) || (0xf < iVar4 >> 3)) {
        __assert_fail("ofs >= 0 && (ofs >> 3) < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ed7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      pbVar11 = (byte *)((long)local_48 + (ulong)(uint)(iVar4 >> 3));
      *pbVar11 = *pbVar11 | ""[*puVar10] << ((byte)iVar4 & 4);
      iVar4 = iVar4 + -4;
      uVar15 = uVar15 + 4;
      puVar10 = puVar10 + 1;
    } while (uVar14 * 4 != uVar15);
    break;
  case 5:
    uVar13 = 0x7b;
    uVar15 = 0;
    do {
      iVar4 = (uint)""[pBlock->m_weights[uVar15]] << ((byte)uVar13 & 7);
      if (uVar15 == 0x19) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ee7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      pbVar11 = (byte *)((long)local_48 + (ulong)(uVar13 >> 3));
      *pbVar11 = *pbVar11 | (byte)iVar4;
      if (uVar13 < 0x78) {
        pbVar11 = (byte *)((long)local_48 + (ulong)(uVar13 >> 3) + 1);
        *pbVar11 = *pbVar11 | (byte)((uint)iVar4 >> 8);
      }
      uVar15 = uVar15 + 1;
      uVar13 = uVar13 - 5;
    } while (uVar14 != uVar15);
  }
  return true;
}

Assistant:

bool pack_astc_block(uint32_t* pDst, const astc_block_desc* pBlock, uint32_t uastc_mode)
	{
		assert(uastc_mode < TOTAL_UASTC_MODES);
		uint8_t* pDst_bytes = reinterpret_cast<uint8_t*>(pDst);

		const int total_weights = pBlock->m_dual_plane ? 32 : 16;

		// Set mode bits - see Table 146-147
		uint32_t mode = g_uastc_mode_astc_block_mode[uastc_mode];
		pDst_bytes[0] = (uint8_t)mode;
		pDst_bytes[1] = (uint8_t)(mode >> 8);

		memset(pDst_bytes + 2, 0, 16 - 2);

		int bit_pos = ASTC_BLOCK_MODE_BITS;

		// We only support 1-5 bit weight indices
		assert(!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]);
		const int bits_per_weight = g_astc_bise_range_table[pBlock->m_weight_range][0];

		// See table 143 - PART
		astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_subsets - 1, ASTC_PART_BITS);

		if (pBlock->m_subsets == 1)
			astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_cem, ASTC_CEM_BITS);
		else
		{
			// See table 145
			astc_set_bits(pDst, bit_pos, pBlock->m_partition_seed, ASTC_PARTITION_INDEX_BITS);

			// Table 150 - we assume all CEM's are equal, so write 2 0's along with the CEM
			astc_set_bits_1_to_9(pDst, bit_pos, (pBlock->m_cem << 2) & 63, ASTC_CEM_BITS + 2);
		}

		if (pBlock->m_dual_plane)
		{
			const int total_weight_bits = total_weights * bits_per_weight;

			// See Illegal Encodings 23.24
			// https://www.khronos.org/registry/DataFormat/specs/1.3/dataformat.1.3.inline.html#_illegal_encodings
			assert((total_weight_bits >= 24) && (total_weight_bits <= 96));

			int ccs_bit_pos = 128 - total_weight_bits - ASTC_CCS_BITS;
			astc_set_bits_1_to_9(pDst, ccs_bit_pos, pBlock->m_ccs, ASTC_CCS_BITS);
		}

		const int num_cem_pairs = (1 + (pBlock->m_cem >> 2)) * pBlock->m_subsets;
		assert(num_cem_pairs <= 9);

		astc_pack_bise(pDst, pBlock->m_endpoints, bit_pos, num_cem_pairs * 2, g_uastc_mode_endpoint_ranges[uastc_mode]);

		// Write the weight bits in reverse bit order.
		switch (bits_per_weight)
		{
		case 1:
		{
			const uint32_t N = 1;
			for (int i = 0; i < total_weights; i++)
			{
				const uint32_t ofs = 128 - N - i;
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (pBlock->m_weights[i] << (ofs & 7));
			}
			break;
		}
		case 2:
		{
			const uint32_t N = 2;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits2[4] = { 0, 2, 1, 3 };
				const uint32_t ofs = 128 - N - (i * N);
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits2[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 3:
		{
			const uint32_t N = 3;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits3[8] = { 0, 4, 2, 6, 1, 5, 3, 7 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits3[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}
			break;
		}
		case 4:
		{
			const uint32_t N = 4;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits4[16] = { 0, 8, 4, 12, 2, 10, 6, 14, 1, 9, 5, 13, 3, 11, 7, 15 };
				const int ofs = 128 - N - (i * N);
				assert(ofs >= 0 && (ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits4[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 5:
		{
			const uint32_t N = 5;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits5[32] = { 0, 16, 8, 24, 4, 20, 12, 28, 2, 18, 10, 26, 6, 22, 14, 30, 1, 17, 9, 25, 5, 21, 13, 29, 3, 19, 11, 27, 7, 23, 15, 31 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits5[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}

			break;
		}
		default:
			assert(0);
			break;
		}

		return true;
	}